

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header7.h
# Opt level: O0

void __thiscall KDIS::PDU::Header7::Header7(Header7 *this,Header7 *param_1)

{
  Header7 *param_1_local;
  Header7 *this_local;
  
  Header6::Header6(&this->super_Header6,&param_1->super_Header6);
  (this->super_Header6)._vptr_Header6 = (_func_int **)&PTR__Header7_0032b3c0;
  *(undefined2 *)&(this->super_Header6).field_0x24 =
       *(undefined2 *)&(param_1->super_Header6).field_0x24;
  (this->super_Header6).field_0x26 = (param_1->super_Header6).field_0x26;
  return;
}

Assistant:

class KDIS_EXPORT Header7 : public Header6
{
protected:

    union
    {
        struct
        {
            KUINT8 m_ui8PDUStatusTEI : 1;                   // Bit  0.
            KUINT8 m_ui8PDUStatusLVC : 2;                   // Bits 1-2.
            KUINT8 m_ui8PDUStatusCEI : 1;                   // Bit  3.

            union
            {
                struct
                {
                    KUINT8 m_ui8PDUStatusFTI  : 1;        // Bit  4.
                    KUINT8 m_ui8PDUStatusBit5 : 1;        // Bit  5.
                };

                KUINT8 m_ui8PDUStatusDTI_RAI_IAI : 2;        // Bits 4-5. Could be used for DTI, RAI or IAI.
            };

            KUINT8 m_ui8PDUStatusBit6 : 1;                      // Bit  6. Unused.
            KUINT8 m_ui8PDUStatusSM   : 1;                      // Bit  7.
        };

        KUINT8 m_ui8PDUStatus;

    } m_PDUStatusUnion;

public:

    Header7();

    Header7(KDataStream &stream) noexcept(false);

    Header7( KDIS::DATA_TYPE::ENUMS::ProtocolVersion PV, KUINT8 ExerciseID, KDIS::DATA_TYPE::ENUMS::PDUType PT,
             KDIS::DATA_TYPE::ENUMS::ProtocolFamily PF, const KDIS::DATA_TYPE::TimeStamp & TS, KUINT16 PDULength );

    virtual ~Header7();

    //************************************
    // FullName:    KDIS::PDU::Header7::SetPDUStatus
    //              KDIS::PDU::Header7::GetPDUStatus
    // Description: The entire PDU status field.
    // Parameter:   KUINT8 S
    //************************************
    void SetPDUStatus( KUINT8 S );
    KUINT8 GetPDUStatus() const;

    //************************************
    // FullName:    KDIS::PDU::Header7::SetPDUStatusCEI
    //              KDIS::PDU::Header7::GetPDUStatusCEI
    // Description: Indicates whether the PDU is Coupled true(1)
    //              or Not Coupled false(0) with an Attribute PDU.
    // PDU:         Applies to all PDU's(1-71) except the Attribute PDU.
    // Parameter:   KBOOL TEI
    //************************************
    void SetPDUStatusCEI( KBOOL CEI );
    KBOOL GetPDUStatusCEI() const;

    //************************************
    // FullName:    KDIS::PDU::Header7::SetPDUStatusTEI
    //              KDIS::PDU::Header7::GetPDUStatusTEI
    // Description: Identifies whether the Simulation Address of the Entity ID contained
    //              in this PDU is the owner of the entity.
    //              false(0) = no difference. The Simulation Address of the Entity ID is the owner of Indicator.
    //              true(1) = difference. The Simulation Address of the Entity ID is not the owner of this entity.
    // PDU:         See Header7 description to see which PDU's use this field.
    // Parameter:   KBOOL TEI
    //************************************
    void SetPDUStatusTEI( KBOOL TEI );
    KBOOL GetPDUStatusTEI() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Header7::SetPDUStatusLVC
    //              KDIS::DATA_TYPE::Header7::GetPDUStatusLVC
    // Description: Indicates whether the data contained in this PDU is related to a
    //              live(1), virtual(2) or constructive(3) entity. If the LVC designation is not
    //              able to be determined, this field shall be set to No Statement(0).
    //              For more information on LVC try the Wikipedia page:
    //              http://en.wikipedia.org/wiki/Live,_Virtual,_and_Constructive
    // PDU:         See Header7 description to see which PDU's use this field.
    // Parameter:   LVCIndicator LVC
    //************************************
    void SetPDUStatusLVC( KDIS::DATA_TYPE::ENUMS::LVCIndicator LVC );
    KDIS::DATA_TYPE::ENUMS::LVCIndicator GetPDUStatusLVC() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Header7::SetPDUStatusFTI
    //              KDIS::DATA_TYPE::Header7::GetPDUStatusFTI
    // Description: Indicates whether the type of object fired was
    //              a Munition false(0) or an Expendable true(1).
    // PDU:         Fire(2)
    // Parameter:   KBOOL FTI
    //************************************
    void SetPDUStatusFTI( KBOOL FTI );
    KBOOL GetPDUStatusFTI() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Header7::SetPDUStatusDTI
    //              KDIS::DATA_TYPE::Header7::GetPDUStatusDTI
    // Description: Indicates whether the type of object that detonated,
    //              exploded or burst was a Munition (0), Expendable (1),
    //              or Non-Munition Explosion (2).
    // PDU:         Detonation(3)
    // Parameter:   DetonationType DTI
    //************************************
    void SetPDUStatusDTI( KDIS::DATA_TYPE::ENUMS::DetonationType DTI );
    KDIS::DATA_TYPE::ENUMS::DetonationType GetPDUStatusDTI() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Header7::SetPDUStatusRAI
    //              KDIS::DATA_TYPE::Header7::GetPDUStatusRAI
    // Description: Used to indicate whether the radio transmitter or receiver
    //              is attached to an entity or object as follows: No Statement(0),
    //              Unattached (1) and Attached (2).
    // PDU:         Transmitter(25), Signal(26), Receiver(27)
    // Parameter:   AttachedIndicator RAI
    //************************************
    void SetPDUStatusRAI( KDIS::DATA_TYPE::ENUMS::AttachedIndicator RAI );
    KDIS::DATA_TYPE::ENUMS::AttachedIndicator GetPDUStatusRAI() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Header7::SetPDUStatusIAI
    //              KDIS::DATA_TYPE::Header7::GetPDUStatusIAI
    // Description: Used to indicate whether the intercom is attached to an entity or
    //              object as follows: No Statement(0), Unattached (1) and Attached (2).
    // PDU:         IntercomSignal(31), IntercomControl(32)
    // Parameter:   AttachedIndicator IAI
    //************************************
    void SetPDUStatusIAI( KDIS::DATA_TYPE::ENUMS::AttachedIndicator RAI );
    KDIS::DATA_TYPE::ENUMS::AttachedIndicator GetPDUStatusIAI() const;

    //************************************
    // FullName:    KDIS::PDU::Header7::SetPDUStatusSM
    //              KDIS::PDU::Header7::GetPDUStatusSM
    // Description: Indicates whether the Simulation Mode field of the Change/Options record
    //              for this IFF PDU is set to Regeneration false(0) or Interactive true(1).
    // PDU:         IFF ATC NAVAIDS(28)
    // Parameter:   KBOOL SM
    //************************************
    void SetPDUStatusSM( KBOOL SM );
    KBOOL GetPDUStatusSM() const;

    //************************************
    // FullName:    KDIS::PDU::Header7::GetAsString
    // Description: Returns a string representation of the PDU.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::PDU::Header7::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    // Parameter:   bool ignoreHeader = false - Decode the header from the stream?
    //************************************
    virtual void Decode(KDataStream &stream, bool ignoreHeader = false) noexcept(false);

    //************************************
    // FullName:    KDIS::PDU::Header7::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const Header7 & Value ) const;
    KBOOL operator != ( const Header7 & Value ) const;
}